

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

char * __thiscall Message::DequeueMessage(Message *this)

{
  char *pcVar1;
  char (*pacVar2) [20];
  char *msg;
  Message *this_local;
  
  pcVar1 = (char *)operator_new__(0x14);
  sem_wait((sem_t *)&this->_empty);
  sem_wait((sem_t *)this);
  pacVar2 = this->_messages + this->_current;
  *(undefined8 *)pcVar1 = *(undefined8 *)*pacVar2;
  *(undefined8 *)(pcVar1 + 8) = *(undefined8 *)(*pacVar2 + 8);
  *(undefined4 *)(pcVar1 + 0x10) = *(undefined4 *)(*pacVar2 + 0x10);
  this->_current = this->_current + -1;
  sem_post((sem_t *)this);
  sem_post((sem_t *)&this->_full);
  return pcVar1;
}

Assistant:

char* Message::DequeueMessage()
{
    char *msg = new char[MaxMessageSize];
    sem_wait(&_empty);
    sem_wait(&_lock);
    memcpy(msg, &_messages[_current], MaxMessageSize*sizeof(char));
    _current -= 1;
    sem_post(&_lock);
    sem_post(&_full);
    return msg;
}